

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

void parser_info_delete(parser_info *info)

{
  node_info *__ptr;
  node_info *node;
  parser_info *info_local;
  
  do {
    if (info->node == (node_info *)0x0) {
      if (info->parser != (XML_Parser)0x0) {
        coda_XML_ParserFree(info->parser);
      }
      if (info->hash_data != (hashtable *)0x0) {
        coda_hashtable_delete(info->hash_data);
      }
      if (info->buffer != (char *)0x0) {
        free(info->buffer);
      }
      info->zf = (za_file *)0x0;
      return;
    }
    __ptr = info->node;
    if (__ptr->data != (void *)0x0) {
      if (__ptr->free_data == (free_data_handler)0x0) {
        __assert_fail("node->free_data != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                      ,0xfdc,"void parser_info_delete(parser_info *)");
      }
      (*__ptr->free_data)(__ptr->data);
    }
    if (__ptr->char_data != (char *)0x0) {
      free(__ptr->char_data);
    }
    info->node = __ptr->parent;
    free(__ptr);
  } while( true );
}

Assistant:

static void parser_info_delete(parser_info *info)
{
    while (info->node != NULL)
    {
        node_info *node;

        node = info->node;
        if (node->data != NULL)
        {
            assert(node->free_data != NULL);
            node->free_data(node->data);
        }
        if (node->char_data != NULL)
        {
            free(node->char_data);
        }
        info->node = node->parent;
        free(node);
    }
    if (info->parser != NULL)
    {
        XML_ParserFree(info->parser);
    }
    if (info->hash_data != NULL)
    {
        hashtable_delete(info->hash_data);
    }
    if (info->buffer != NULL)
    {
        free(info->buffer);
    }
    info->zf = NULL;
}